

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::clara::detail::Parser::writeToStream(Parser *this,ostream *os)

{
  pointer pAVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  ulong uVar6;
  Column *pCVar7;
  HelpColumns *cols;
  pointer pHVar8;
  size_t newWidth;
  ulong uVar9;
  pointer pAVar10;
  Column local_108;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_> rows
  ;
  Columns local_c0;
  Columns row;
  Column local_90;
  Column local_60;
  
  ExeName::name_abi_cxx11_((string *)&local_108,&this->m_exeName);
  ::std::__cxx11::string::~string((string *)&local_108);
  if (local_108.m_strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    poVar5 = ::std::operator<<(os,"usage:\n");
    poVar5 = ::std::operator<<(poVar5,"  ");
    ExeName::name_abi_cxx11_((string *)&local_108,&this->m_exeName);
    poVar5 = ::std::operator<<(poVar5,(string *)&local_108);
    ::std::operator<<(poVar5," ");
    ::std::__cxx11::string::~string((string *)&local_108);
    pAVar1 = (this->m_args).
             super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = true;
    bVar2 = true;
    for (pAVar10 = (this->m_args).
                   super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
                   ._M_impl.super__Vector_impl_data._M_start; pAVar10 != pAVar1;
        pAVar10 = pAVar10 + 1) {
      if (!bVar3) {
        ::std::operator<<(os," ");
      }
      if (((pAVar10->super_ParserRefImpl<Catch::clara::detail::Arg>).m_optionality == Optional) &&
         (bVar2)) {
        ::std::operator<<(os,"[");
        bVar2 = false;
      }
      poVar5 = ::std::operator<<(os,"<");
      ::std::__cxx11::string::string
                ((string *)&local_108,
                 &(pAVar10->super_ParserRefImpl<Catch::clara::detail::Arg>).m_hint);
      poVar5 = ::std::operator<<(poVar5,(string *)&local_108);
      ::std::operator<<(poVar5,">");
      ::std::__cxx11::string::~string((string *)&local_108);
      iVar4 = (*(pAVar10->super_ParserRefImpl<Catch::clara::detail::Arg>).
                super_ComposableParserImpl<Catch::clara::detail::Arg>.super_ParserBase.
                _vptr_ParserBase[4])(pAVar10);
      if (CONCAT44(extraout_var,iVar4) == 0) {
        ::std::operator<<(os," ... ");
      }
      bVar3 = false;
    }
    if (!bVar2) {
      ::std::operator<<(os,"]");
    }
    if ((this->m_options).
        super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->m_options).
        super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ::std::operator<<(os," options");
    }
    poVar5 = ::std::operator<<(os,"\n\nwhere options are:");
    ::std::endl<char,std::char_traits<char>>(poVar5);
  }
  getHelpColumns(&rows,this);
  uVar6 = 0;
  for (pHVar8 = rows.
                super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pHVar8 != rows.
                super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                ._M_impl.super__Vector_impl_data._M_finish; pHVar8 = pHVar8 + 1) {
    uVar9 = (pHVar8->left)._M_string_length + 2;
    if (uVar6 <= uVar9) {
      uVar6 = uVar9;
    }
  }
  newWidth = 0x28;
  if (uVar6 < 0x28) {
    newWidth = uVar6;
  }
  for (pHVar8 = rows.
                super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pHVar8 != rows.
                super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                ._M_impl.super__Vector_impl_data._M_finish; pHVar8 = pHVar8 + 1) {
    TextFlow::Column::Column(&local_108,&pHVar8->left);
    pCVar7 = TextFlow::Column::width(&local_108,newWidth);
    pCVar7->m_indent = 2;
    TextFlow::Spacer::Spacer((Spacer *)&local_90,4);
    TextFlow::Column::operator+(&local_c0,pCVar7,&local_90);
    TextFlow::Column::Column(&local_60,&pHVar8->right);
    pCVar7 = TextFlow::Column::width(&local_60,0x49 - newWidth);
    TextFlow::Columns::operator+(&row,&local_c0,pCVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60.m_strings);
    std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
    ~vector(&local_c0.m_columns);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90.m_strings);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108.m_strings);
    poVar5 = TextFlow::operator<<(os,&row);
    ::std::endl<char,std::char_traits<char>>(poVar5);
    std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
    ~vector(&row.m_columns);
  }
  std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  ::~vector(&rows);
  return;
}

Assistant:

void writeToStream( std::ostream &os ) const {
            if (!m_exeName.name().empty()) {
                os << "usage:\n" << "  " << m_exeName.name() << " ";
                bool required = true, first = true;
                for( auto const &arg : m_args ) {
                    if (first)
                        first = false;
                    else
                        os << " ";
                    if( arg.isOptional() && required ) {
                        os << "[";
                        required = false;
                    }
                    os << "<" << arg.hint() << ">";
                    if( arg.cardinality() == 0 )
                        os << " ... ";
                }
                if( !required )
                    os << "]";
                if( !m_options.empty() )
                    os << " options";
                os << "\n\nwhere options are:" << std::endl;
            }

            auto rows = getHelpColumns();
            size_t consoleWidth = CATCH_CLARA_CONFIG_CONSOLE_WIDTH;
            size_t optWidth = 0;
            for( auto const &cols : rows )
                optWidth = (std::max)(optWidth, cols.left.size() + 2);

            optWidth = (std::min)(optWidth, consoleWidth/2);

            for( auto const &cols : rows ) {
                auto row =
                        TextFlow::Column( cols.left ).width( optWidth ).indent( 2 ) +
                        TextFlow::Spacer(4) +
                        TextFlow::Column( cols.right ).width( consoleWidth - 7 - optWidth );
                os << row << std::endl;
            }
        }